

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

void __thiscall tcu::LogImageSet::~LogImageSet(LogImageSet *this)

{
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LogImageSet (const std::string& name, const std::string& description)
		: m_name		(name)
		, m_description	(description)
	{
	}